

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void kmp_set_stacksize(int arg)

{
  undefined4 unaff_retaddr;
  
  __kmp_aux_set_stacksize(CONCAT44(arg,unaff_retaddr));
  return;
}

Assistant:

void FTN_STDCALL FTN_SET_STACKSIZE(int KMP_DEREF arg) {
#ifdef KMP_STUB
  __kmps_set_stacksize(KMP_DEREF arg);
#else
  // __kmp_aux_set_stacksize initializes the library if needed
  __kmp_aux_set_stacksize((size_t)KMP_DEREF arg);
#endif
}